

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O1

void __thiscall
spdlog::sinks::ansicolor_sink<spdlog::details::console_mutex>::set_color
          (ansicolor_sink<spdlog::details::console_mutex> *this,level_enum color_level,
          string_view_t color)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  undefined8 uVar2;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  __mutex = (pthread_mutex_t *)this->mutex_;
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,color.data_,color.data_ + color.size_);
  if (color_level < n_levels) {
    std::__cxx11::string::operator=
              ((string *)((this->colors_)._M_elems + (int)color_level),(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  uVar2 = std::__throw_out_of_range_fmt
                    ("array::at: __n (which is %zu) >= _Nm (which is %zu)",(long)(int)color_level,7)
  ;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  pthread_mutex_unlock(__mutex);
  _Unwind_Resume(uVar2);
}

Assistant:

SPDLOG_INLINE void ansicolor_sink<ConsoleMutex>::set_color(level::level_enum color_level,
                                                           string_view_t color) {
    std::lock_guard<mutex_t> lock(mutex_);
    colors_.at(static_cast<size_t>(color_level)) = to_string_(color);
}